

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QString * __thiscall
QDirPrivate::resolveAbsoluteEntry(QString *__return_storage_ptr__,QDirPrivate *this)

{
  QFileSystemEntry *this_00;
  QAbstractFileEngine *pQVar1;
  qint16 qVar2;
  undefined1 *puVar3;
  bool bVar4;
  QFileSystemEntry *this_01;
  long in_FS_OFFSET;
  QArrayData *data;
  QFileSystemEntry absoluteFileSystemEntry;
  QString local_98;
  undefined1 local_78 [52];
  qint16 qStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->fileCache).absoluteDirEntry;
  bVar4 = QFileSystemEntry::isEmpty(this_00);
  if (!bVar4) {
    this_01 = this_00;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001445dd;
    goto LAB_00144369;
  }
  this_01 = &this->dirEntry;
  bVar4 = QFileSystemEntry::isEmpty(this_01);
  if (bVar4) {
LAB_00144333:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_00144369:
      QFileSystemEntry::filePath(__return_storage_ptr__,this_01);
      return __return_storage_ptr__;
    }
  }
  else {
    pQVar1 = (this->fileEngine)._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    if (pQVar1 == (QAbstractFileEngine *)0x0) {
      bVar4 = QFileSystemEntry::isRelative(this_01);
      if ((!bVar4) && (bVar4 = QFileSystemEntry::isClean(this_01), bVar4)) {
        QString::operator=(&this_00->m_filePath,&this_01->m_filePath);
        QByteArray::operator=
                  (&(this->fileCache).absoluteDirEntry.m_nativeFilePath,
                   &(this->dirEntry).m_nativeFilePath);
        qVar2 = (this->dirEntry).m_firstDotInFileName;
        (this->fileCache).absoluteDirEntry.m_lastSeparator = (this->dirEntry).m_lastSeparator;
        (this->fileCache).absoluteDirEntry.m_firstDotInFileName = qVar2;
        (this->fileCache).absoluteDirEntry.m_lastDotInFileName =
             (this->dirEntry).m_lastDotInFileName;
        goto LAB_00144333;
      }
      QFileSystemEngine::absoluteName((QFileSystemEntry *)local_78,this_01);
      QFileSystemEntry::filePath(&local_98,(QFileSystemEntry *)local_78);
      data = &(local_98.d.d)->super_QArrayData;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char16_t *)0x0;
      local_98.d.size = 0;
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    }
    else {
      (*pQVar1->_vptr_QAbstractFileEngine[0x19])(local_78,pQVar1,3);
      data = (QArrayData *)local_78._0_8_;
    }
    stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.d.d = (Data *)data;
    qt_cleanPath(&local_98);
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QString::operator=(&this_00->m_filePath,(QString *)local_78);
    QByteArray::operator=
              (&(this->fileCache).absoluteDirEntry.m_nativeFilePath,(QByteArray *)(local_78 + 0x18))
    ;
    puVar3 = stack0xffffffffffffffb8;
    (this->fileCache).absoluteDirEntry.m_lastSeparator = local_78._48_2_;
    (this->fileCache).absoluteDirEntry.m_firstDotInFileName = local_78._50_2_;
    qStack_44 = SUB82(puVar3,4);
    (this->fileCache).absoluteDirEntry.m_lastDotInFileName = qStack_44;
    unique0x10000853 = puVar3;
    QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_78);
    if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
      }
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
LAB_001445dd:
  __stack_chk_fail();
}

Assistant:

inline QString QDirPrivate::resolveAbsoluteEntry() const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.absoluteDirEntry.isEmpty())
        return fileCache.absoluteDirEntry.filePath();

    if (dirEntry.isEmpty())
        return dirEntry.filePath();

    QString absoluteName;
    if (!fileEngine) {
        if (!dirEntry.isRelative() && dirEntry.isClean()) {
            fileCache.absoluteDirEntry = dirEntry;
            return dirEntry.filePath();
        }

        absoluteName = QFileSystemEngine::absoluteName(dirEntry).filePath();
    } else {
        absoluteName = fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
    }
    auto absoluteFileSystemEntry =
            QFileSystemEntry(QDir::cleanPath(absoluteName), QFileSystemEntry::FromInternalPath());
    fileCache.absoluteDirEntry = absoluteFileSystemEntry;
    return absoluteFileSystemEntry.filePath();
}